

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type time_plain<trng::mrg3s>(mrg3s *r)

{
  int iVar1;
  result_type rVar2;
  ulong uVar3;
  time_t *in_RSI;
  string res;
  long i;
  long max;
  timer T;
  result_type s;
  double *in_stack_00000128;
  mrg3s *in_stack_ffffffffffffff90;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  int local_c;
  
  local_c = 0;
  timer::timer((timer *)in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    rVar2 = trng::mrg3s::operator()(in_stack_ffffffffffffff90);
    local_c = rVar2 + local_c;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar3 = std::__cxx11::string::length();
    if (9 < uVar3) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  iVar1 = local_c;
  std::__cxx11::string::~string(local_50);
  return iVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}